

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

void core::image::tiff_error_handler(char *param_1,char *fmt,__va_list_tag *ap)

{
  Exception *this;
  char local_848 [8];
  char msg [2048];
  string local_40;
  allocator local_19;
  
  vsprintf(local_848,fmt,ap);
  this = (Exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_40,local_848,&local_19);
  util::Exception::Exception(this,&local_40);
  __cxa_throw(this,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
tiff_error_handler (char const* /*module*/, char const* fmt, va_list ap)
{
    char msg[2048];
    ::vsprintf(msg, fmt, ap);
    throw util::Exception(msg);
}